

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O1

int fitsio_init_lock(void)

{
  return 0;
}

Assistant:

int fitsio_init_lock(void)
{
  int status = 0;
  
#ifdef _REENTRANT

  static int need_to_init = 1;

  pthread_mutexattr_t mutex_init;

  FFLOCK1(Fitsio_InitLock);

  if (need_to_init) {

    /* Init the main fitsio lock here since we need a a recursive lock */

    status = pthread_mutexattr_init(&mutex_init);
    if (status) {
        ffpmsg("pthread_mutexattr_init failed (fitsio_init_lock)");
        return(status);
    }

#ifdef __GLIBC__
    status = pthread_mutexattr_settype(&mutex_init,
				     PTHREAD_MUTEX_RECURSIVE_NP);
#else
    status = pthread_mutexattr_settype(&mutex_init,
				     PTHREAD_MUTEX_RECURSIVE);
#endif
    if (status) {
        ffpmsg("pthread_mutexattr_settype failed (fitsio_init_lock)");
        return(status);
    }

    status = pthread_mutex_init(&Fitsio_Lock,&mutex_init);
    if (status) {
        ffpmsg("pthread_mutex_init failed (fitsio_init_lock)");
        return(status);
    }

    need_to_init = 0;
  }

  FFUNLOCK1(Fitsio_InitLock);

#endif

    return(status);
}